

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAT12.cpp
# Opt level: O3

void __thiscall Storage::Disk::FAT12::FAT12(FAT12 *this,string *file_name)

{
  FileHolder *this_00;
  int iVar1;
  int sectors_per_track;
  long lVar2;
  uint8_t sector_size;
  uint16_t uVar3;
  uint16_t uVar4;
  uint uVar5;
  stat *psVar6;
  undefined4 *puVar7;
  
  MFMSectorDump::MFMSectorDump(&this->super_MFMSectorDump,file_name);
  (this->super_MFMSectorDump).super_DiskImage._vptr_DiskImage =
       (_func_int **)&PTR__MFMSectorDump_005a2460;
  this_00 = &(this->super_MFMSectorDump).file_;
  psVar6 = FileHolder::stats(this_00);
  lVar2 = psVar6->st_size;
  if (lVar2 < 0x200) {
    puVar7 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar7 = 0xfffffffe;
    __cxa_throw(puVar7,&Error::typeinfo,0);
  }
  FileHolder::seek(this_00,0xb,0);
  uVar3 = FileHolder::get16le(this_00);
  this->sector_size_ = (uint)uVar3;
  FileHolder::seek(this_00,0x13,0);
  uVar3 = FileHolder::get16le(this_00);
  FileHolder::seek(this_00,0x18,0);
  uVar4 = FileHolder::get16le(this_00);
  this->sector_count_ = (uint)uVar4;
  uVar4 = FileHolder::get16le(this_00);
  this->head_count_ = (uint)uVar4;
  iVar1 = this->sector_size_;
  uVar5 = (uint)uVar3;
  if (lVar2 == (int)(iVar1 * uVar5)) {
    sectors_per_track = this->sector_count_;
    lVar2 = (long)(int)((uint)uVar4 * sectors_per_track);
    if ((int)((long)(ulong)uVar5 % lVar2) == 0) {
      this->track_count_ = (int)((long)(ulong)uVar5 / lVar2);
      if (iVar1 == 0x200) {
        sector_size = '\x02';
      }
      else if (iVar1 == 0x400) {
        sector_size = '\x03';
      }
      else {
        if (iVar1 != 0x800) {
          puVar7 = (undefined4 *)__cxa_allocate_exception(4);
          *puVar7 = 0xfffffffe;
          __cxa_throw(puVar7,&Error::typeinfo,0);
        }
        sector_size = '\x04';
      }
      MFMSectorDump::set_geometry
                (&this->super_MFMSectorDump,sectors_per_track,sector_size,'\x01',
                 (10 < sectors_per_track) + Double);
      return;
    }
  }
  puVar7 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar7 = 0xfffffffe;
  __cxa_throw(puVar7,&Error::typeinfo,0);
}

Assistant:

FAT12::FAT12(const std::string &file_name) :
	MFMSectorDump(file_name) {
	// The only sanity check here is whether a sensible
	// geometry is encoded in the first sector, or can be guessed.
	const auto file_size = file_.stats().st_size;

	if(file_size < 512) throw Error::InvalidFormat;

	// Inspect the FAT.
	file_.seek(11, SEEK_SET);
	sector_size_ = file_.get16le();
	file_.seek(19, SEEK_SET);
	const uint16_t total_sectors = file_.get16le();
	file_.seek(24, SEEK_SET);
	sector_count_ = file_.get16le();
	head_count_ = file_.get16le();

	// Throw if there would seemingly be an incomplete track.
	if(file_size != total_sectors*sector_size_) throw Error::InvalidFormat;
	if(total_sectors % (head_count_ * sector_count_)) throw Error::InvalidFormat;
	track_count_ = int(total_sectors / (head_count_ * sector_count_));

	// Check that there is a valid power-of-two sector size.
	uint8_t log_sector_size = 2;
	while(log_sector_size < 5 && (1 << (7+log_sector_size)) != sector_size_) {
		++log_sector_size;
	}
	if(log_sector_size >= 5) throw Error::InvalidFormat;

	set_geometry(
		sector_count_,
		log_sector_size,
		1,
		sector_count_ > 10 ? Encodings::MFM::Density::High : Encodings::MFM::Density::Double
	);
}